

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  bool bVar1;
  undefined8 uVar2;
  Argument *pAVar3;
  reference this_00;
  reference pOVar4;
  ulong uVar5;
  long lVar6;
  allocator local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ulong local_178;
  size_t remaining;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string flag;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [8];
  string line;
  Option *option_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *__range1_1;
  size_t length;
  Option *option;
  iterator __end1;
  iterator __begin1;
  vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *__range1;
  size_t longest_name_length;
  size_t kExtraSpace;
  Argument *argument;
  size_t i;
  OptionParser *this_local;
  
  uVar2 = std::__cxx11::string::c_str((string *)this);
  printf("usage: %s [options]",uVar2);
  for (argument = (Argument *)0x0;
      pAVar3 = (Argument *)
               std::
               vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
               size(&this->arguments_), argument < pAVar3;
      argument = (Argument *)&(argument->name).field_0x1) {
    this_00 = std::
              vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
              operator[](&this->arguments_,(size_type)argument);
    if (this_00->count == One) {
      uVar2 = std::__cxx11::string::c_str((string *)this_00);
      printf(" %s",uVar2);
    }
    else if (this_00->count == OneOrMore) {
      uVar2 = std::__cxx11::string::c_str((string *)this_00);
      printf(" %s+",uVar2);
    }
  }
  printf("\n\n");
  uVar2 = std::__cxx11::string::c_str((string *)&this->description_);
  printf("%s\n",uVar2);
  printf("options:\n");
  __range1 = (vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)0x0;
  __end1 = std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::
           begin(&this->options_);
  option = (Option *)
           std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::end
                     (&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
                                     *)&option), bVar1) {
    pOVar4 = __gnu_cxx::
             __normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
             ::operator*(&__end1);
    uVar5 = std::__cxx11::string::empty((string *)&pOVar4->long_name);
    if ((uVar5 & 1) == 0) {
      __range1_1 = (vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                    *)std::__cxx11::string::size((string *)&pOVar4->long_name);
      uVar5 = std::__cxx11::string::empty((string *)&pOVar4->metavar);
      if ((uVar5 & 1) == 0) {
        lVar6 = std::__cxx11::string::size((string *)&pOVar4->metavar);
        __range1_1 = (vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      *)((long)&(__range1_1->
                                super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar6 + 1);
      }
      if (__range1 < __range1_1) {
        __range1 = __range1_1;
      }
    }
    __gnu_cxx::
    __normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::
             begin(&this->options_);
  option_1 = (Option *)
             std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::
             end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
                             *)&option_1), bVar1) {
    line.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
         ::operator*(&__end1_1);
    if ((((reference)line.field_2._8_8_)->short_name != '\0') ||
       (uVar5 = std::__cxx11::string::empty((string *)&((reference)line.field_2._8_8_)->long_name),
       (uVar5 & 1) == 0)) {
      std::__cxx11::string::string(local_98);
      if (*(char *)line.field_2._8_8_ == '\0') {
        std::__cxx11::string::operator+=(local_98,"      ");
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"  -",&local_f9);
        std::operator+(&local_d8,&local_f8,*(char *)line.field_2._8_8_);
        std::operator+(&local_b8,&local_d8,", ");
        std::__cxx11::string::operator+=(local_98,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      std::__cxx11::string::string((string *)local_130);
      uVar5 = std::__cxx11::string::empty((string *)(line.field_2._8_8_ + 8));
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator=((string *)local_130,"--");
        uVar5 = std::__cxx11::string::empty((string *)(line.field_2._8_8_ + 0x28));
        if ((uVar5 & 1) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &remaining,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (line.field_2._8_8_ + 8),'=');
          std::operator+(&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &remaining,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (line.field_2._8_8_ + 0x28));
          std::__cxx11::string::operator+=((string *)local_130,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&remaining);
        }
        else {
          std::__cxx11::string::operator+=((string *)local_130,(string *)(line.field_2._8_8_ + 8));
        }
      }
      lVar6 = std::__cxx11::string::size((string *)local_130);
      uVar5 = (long)__range1 + (10 - lVar6);
      local_178 = uVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b8,uVar5,' ',&local_1b9);
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     &local_1b8);
      std::__cxx11::string::operator+=(local_98,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      uVar5 = std::__cxx11::string::empty((string *)(line.field_2._8_8_ + 0x50));
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=(local_98,(string *)(line.field_2._8_8_ + 0x50));
      }
      uVar2 = std::__cxx11::string::c_str(local_98);
      printf("%s\n",uVar2);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string(local_98);
    }
    __gnu_cxx::
    __normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}